

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

SQInteger __thiscall
SQString::Next(SQString *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  long x;
  SQInteger SVar1;
  
  if ((refpos->super_SQObject)._type == OT_INTEGER) {
    x = (refpos->super_SQObject)._unVal.nInteger;
  }
  else {
    x = 0;
  }
  if (x < this->_len) {
    SQObjectPtr::operator=(outkey,x);
    SQObjectPtr::operator=(outval,(long)this->_val[x]);
    SVar1 = x + 1;
  }
  else {
    SVar1 = -1;
  }
  return SVar1;
}

Assistant:

SQInteger SQString::Next(const SQObjectPtr &refpos, SQObjectPtr &outkey, SQObjectPtr &outval)
{
    SQInteger idx = (SQInteger)TranslateIndex(refpos);
    while(idx < _len){
        outkey = (SQInteger)idx;
        outval = (SQInteger)((SQUnsignedInteger)_val[idx]);
        //return idx for the next iteration
        return ++idx;
    }
    //nothing to iterate anymore
    return -1;
}